

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void uv__signal_global_init(void)

{
  int iVar1;
  
  if ((uv__signal_lock_pipefd[0] == 0) &&
     (iVar1 = pthread_atfork((__prepare *)0x0,(__parent *)0x0,uv__signal_global_reinit), iVar1 != 0)
     ) {
    abort();
  }
  iVar1 = uv__make_pipe(uv__signal_lock_pipefd,0);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = uv__signal_unlock();
  if (iVar1 == 0) {
    return;
  }
  abort();
}

Assistant:

static void uv__signal_global_init(void) {
  if (!uv__signal_lock_pipefd[0])
    /* pthread_atfork can register before and after handlers, one
     * for each child. This only registers one for the child. That
     * state is both persistent and cumulative, so if we keep doing
     * it the handler functions will be called multiple times. Thus
     * we only want to do it once.
     */
    if (pthread_atfork(NULL, NULL, &uv__signal_global_reinit))
      abort();

  if (uv__make_pipe(uv__signal_lock_pipefd, 0))
    abort();

  if (uv__signal_unlock())
    abort();
}